

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

vector<Config::Size,_std::allocator<Config::Size>_> *
App::arrangeGlyphs(vector<Config::Size,_std::allocator<Config::Size>_> *__return_storage_ptr__,
                  Glyphs *glyphs,Config *config)

{
  pointer *this;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  bool bVar5;
  uint width;
  uint height;
  uint32_t uVar6;
  uint32_t uVar7;
  reference pRVar8;
  value_type *pvVar9;
  const_reference pvVar10;
  undefined1 *puVar11;
  runtime_error *this_00;
  reference pRVar12;
  mapped_type *pmVar13;
  size_type sVar14;
  uint32_t y;
  uint32_t x;
  Rect *r;
  iterator __end2_1;
  iterator __begin2_1;
  vector<rbp::Rect,_std::allocator<rbp::Rect>_> *__range2_1;
  uint local_118;
  uint32_t maxY;
  uint32_t maxX;
  uint64_t textureSquare;
  uint32_t workAreaH;
  uint32_t workAreaW;
  value_type *ss;
  size_t i_1;
  RectSize *i;
  iterator __end2;
  iterator __begin2;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *__range2;
  uint64_t allGlyphSquare;
  Size lastSize;
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> glyphRectanglesCopy;
  vector<rbp::Rect,_std::allocator<rbp::Rect>_> arrangedRectangles;
  MaxRectsBinPack mrbp;
  undefined1 local_48 [8];
  vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> glyphRectangles;
  uint32_t additionalHeight;
  uint32_t additionalWidth;
  Config *config_local;
  Glyphs *glyphs_local;
  vector<Config::Size,_std::allocator<Config::Size>_> *result;
  
  uVar6 = (config->spacing).hor;
  uVar7 = (config->padding).right;
  uVar1 = (config->padding).left;
  uVar2 = (config->spacing).ver;
  uVar3 = (config->padding).up;
  uVar4 = (config->padding).down;
  glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<Config::Size,_std::allocator<Config::Size>_>::vector(__return_storage_ptr__);
  getGlyphRectangles((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48,glyphs,
                     uVar6 + uVar1 + uVar7,uVar2 + uVar3 + uVar4,config);
  rbp::MaxRectsBinPack::MaxRectsBinPack
            ((MaxRectsBinPack *)
             &arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::vector
              ((vector<rbp::Rect,_std::allocator<rbp::Rect>_> *)
               &glyphRectanglesCopy.
                super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::vector
              ((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)&lastSize,
               (vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48);
    Config::Size::Size((Size *)&allGlyphSquare);
    __range2 = (vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)0x0;
    __end2 = std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::begin
                       ((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48);
    i = (RectSize *)
        std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::end
                  ((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<rbp::RectSize_*,_std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>_>
                                       *)&i), bVar5) {
      pRVar8 = __gnu_cxx::
               __normal_iterator<rbp::RectSize_*,_std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>_>
               ::operator*(&__end2);
      __range2 = (vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)
                 ((long)&(__range2->
                         super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>)._M_impl.
                         super__Vector_impl_data._M_start +
                 (long)pRVar8->width * (long)pRVar8->height);
      __gnu_cxx::
      __normal_iterator<rbp::RectSize_*,_std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>_>
      ::operator++(&__end2);
    }
    for (ss = (value_type *)0x0;
        pvVar9 = (value_type *)
                 std::vector<Config::Size,_std::allocator<Config::Size>_>::size
                           (&config->textureSizeList), ss < pvVar9;
        ss = (value_type *)((long)&ss->w + 1)) {
      pvVar10 = std::vector<Config::Size,_std::allocator<Config::Size>_>::operator[]
                          (&config->textureSizeList,(size_type)ss);
      width = pvVar10->w - (config->spacing).hor;
      height = pvVar10->h - (config->spacing).ver;
      if ((__range2 <=
           (vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)((ulong)width * (ulong)height))
         || (puVar11 = (undefined1 *)
                       std::vector<Config::Size,_std::allocator<Config::Size>_>::size
                                 (&config->textureSizeList),
            puVar11 <= (undefined1 *)((long)&ss->w + 1U))) {
        allGlyphSquare = *(uint64_t *)pvVar10;
        std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::operator=
                  ((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48,
                   (vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)&lastSize);
        rbp::MaxRectsBinPack::Init
                  ((MaxRectsBinPack *)
                   &arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,width,height);
        rbp::MaxRectsBinPack::Insert
                  ((MaxRectsBinPack *)
                   &arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48,
                   (vector<rbp::Rect,_std::allocator<rbp::Rect>_> *)
                   &glyphRectanglesCopy.
                    super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,RectBestAreaFit);
        bVar5 = std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::empty
                          ((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48);
        if (bVar5) break;
      }
    }
    bVar5 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::empty
                      ((vector<rbp::Rect,_std::allocator<rbp::Rect>_> *)
                       &glyphRectanglesCopy.
                        super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar5) {
      bVar5 = std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::empty
                        ((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48);
      if (!bVar5) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"can not fit glyphs into texture");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar5 = true;
    }
    else {
      local_118 = 0;
      __range2_1._4_4_ = 0;
      this = &glyphRectanglesCopy.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      __end2_1 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::begin
                           ((vector<rbp::Rect,_std::allocator<rbp::Rect>_> *)this);
      r = (Rect *)std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::end
                            ((vector<rbp::Rect,_std::allocator<rbp::Rect>_> *)this);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<rbp::Rect_*,_std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>_>
                                 *)&r), bVar5) {
        pRVar12 = __gnu_cxx::
                  __normal_iterator<rbp::Rect_*,_std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>_>
                  ::operator*(&__end2_1);
        uVar6 = pRVar12->x + (config->spacing).hor;
        uVar7 = pRVar12->y + (config->spacing).ver;
        pmVar13 = std::
                  map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                  ::operator[](glyphs,&pRVar12->tag);
        pmVar13->x = uVar6;
        pmVar13 = std::
                  map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                  ::operator[](glyphs,&pRVar12->tag);
        pmVar13->y = uVar7;
        sVar14 = std::vector<Config::Size,_std::allocator<Config::Size>_>::size
                           (__return_storage_ptr__);
        pmVar13 = std::
                  map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                  ::operator[](glyphs,&pRVar12->tag);
        pmVar13->page = (uint32_t)sVar14;
        if (local_118 < uVar6 + pRVar12->width) {
          local_118 = uVar6 + pRVar12->width;
        }
        if (__range2_1._4_4_ < uVar7 + pRVar12->height) {
          __range2_1._4_4_ = uVar7 + pRVar12->height;
        }
        __gnu_cxx::
        __normal_iterator<rbp::Rect_*,_std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>_>::
        operator++(&__end2_1);
      }
      if ((config->cropTexturesWidth & 1U) != 0) {
        allGlyphSquare = CONCAT44(allGlyphSquare._4_4_,local_118);
      }
      if ((config->cropTexturesHeight & 1U) != 0) {
        allGlyphSquare = CONCAT44(__range2_1._4_4_,(undefined4)allGlyphSquare);
      }
      std::vector<Config::Size,_std::allocator<Config::Size>_>::push_back
                (__return_storage_ptr__,(value_type *)&allGlyphSquare);
      bVar5 = false;
    }
    std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::~vector
              ((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)&lastSize);
    std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::~vector
              ((vector<rbp::Rect,_std::allocator<rbp::Rect>_> *)
               &glyphRectanglesCopy.
                super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (bVar5) {
      glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      rbp::MaxRectsBinPack::~MaxRectsBinPack
                ((MaxRectsBinPack *)
                 &arrangedRectangles.super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<rbp::RectSize,_std::allocator<rbp::RectSize>_>::~vector
                ((vector<rbp::RectSize,_std::allocator<rbp::RectSize>_> *)local_48);
      if ((glyphRectangles.super__Vector_base<rbp::RectSize,_std::allocator<rbp::RectSize>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::vector<Config::Size,_std::allocator<Config::Size>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<Config::Size> App::arrangeGlyphs(Glyphs& glyphs, const Config& config)
{
    const auto additionalWidth = config.spacing.hor + config.padding.left + config.padding.right;
    const auto additionalHeight = config.spacing.ver + config.padding.up + config.padding.down;
    std::vector<Config::Size> result;

    auto glyphRectangles = getGlyphRectangles(glyphs, additionalWidth, additionalHeight, config);

    rbp::MaxRectsBinPack mrbp;

    for (;;)
    {
        std::vector<rbp::Rect> arrangedRectangles;
        auto glyphRectanglesCopy = glyphRectangles;
        Config::Size lastSize;

        uint64_t allGlyphSquare = 0;
        for (const auto& i : glyphRectangles)
            allGlyphSquare += static_cast<uint64_t>(i.width) * i.height;

        for (size_t i = 0; i < config.textureSizeList.size(); ++i)
        {
            const auto& ss = config.textureSizeList[i];

            //TODO: check workAreaW,H
            const auto workAreaW = ss.w - config.spacing.hor;
            const auto workAreaH = ss.h - config.spacing.ver;

            uint64_t textureSquare = static_cast<uint64_t>(workAreaW) * workAreaH;
            if (textureSquare < allGlyphSquare && i + 1 < config.textureSizeList.size())
                continue;

            lastSize = ss;
            glyphRectangles = glyphRectanglesCopy;

            mrbp.Init(workAreaW, workAreaH);
            mrbp.Insert(glyphRectangles, arrangedRectangles, rbp::MaxRectsBinPack::RectBestAreaFit);

            if (glyphRectangles.empty())
                break;
        }

        if (arrangedRectangles.empty())
        {
            if (!glyphRectangles.empty())
                throw std::runtime_error("can not fit glyphs into texture");
            break;
        }

        std::uint32_t maxX = 0;
        std::uint32_t maxY = 0;
        for (const auto& r: arrangedRectangles)
        {
            std::uint32_t x = r.x + config.spacing.hor;
            std::uint32_t y = r.y + config.spacing.ver;

            glyphs[r.tag].x = x;
            glyphs[r.tag].y = y;
            glyphs[r.tag].page = static_cast<std::uint32_t>(result.size());

            if (maxX < x + r.width)
                maxX = x + r.width;
            if (maxY < y + r.height)
                maxY = y + r.height;
        }
        if (config.cropTexturesWidth)
            lastSize.w = maxX;
        if (config.cropTexturesHeight)
            lastSize.h = maxY;

        result.push_back(lastSize);
    }

    return result;
}